

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O2

bool __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::dequeue_for
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *popped_item,
          milliseconds wait_duration)

{
  bool bVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  
  local_30.__r = wait_duration.__r;
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->queue_mutex_);
  bVar1 = std::condition_variable::
          wait_for<long,std::ratio<1l,1000l>,spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::dequeue_for(spdlog::details::async_msg&,std::chrono::duration<long,std::ratio<1l,1000l>>)::_lambda()_1_>
                    (&this->push_cv_,&local_40,&local_30,(anon_class_8_1_8991fb9c)this);
  if (bVar1) {
    async_msg::operator=
              (popped_item,
               (this->q_).v_.
               super__Vector_base<spdlog::details::async_msg,_std::allocator<spdlog::details::async_msg>_>
               ._M_impl.super__Vector_impl_data._M_start + (this->q_).head_);
    (this->q_).head_ = ((this->q_).head_ + 1) % (this->q_).max_items_;
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    std::condition_variable::notify_one();
  }
  else {
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  }
  return bVar1;
}

Assistant:

bool dequeue_for(T &popped_item, std::chrono::milliseconds wait_duration)
    {
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            if (!push_cv_.wait_for(lock, wait_duration, [this] { return !this->q_.empty(); }))
            {
                return false;
            }
            popped_item = std::move(q_.front());
            q_.pop_front();
        }
        pop_cv_.notify_one();
        return true;
    }